

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::ObjectIntersectorK<4,_true>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  AABBNodeMB4D *node1;
  ulong uVar7;
  RTCIntersectFunctionN p_Var8;
  long lVar9;
  ulong uVar10;
  NodeRef *pNVar11;
  size_t sVar12;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar13;
  uint uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar21;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar22;
  undefined1 auVar23 [64];
  vint4 ai;
  undefined1 auVar24 [16];
  undefined1 in_ZMM3 [64];
  vint4 ai_1;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vint4 ai_3;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 ai_2;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 bi;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  vint4 bi_1;
  undefined1 auVar39 [16];
  vint4 bi_3;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 bi_2;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 local_1808 [16];
  RTCIntersectFunctionNArguments local_17c0;
  Geometry *local_1790;
  undefined8 local_1788;
  RTCIntersectArguments *local_1780;
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  sVar12 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar12 != 8) {
    auVar20 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    auVar19 = vpcmpeqd_avx(auVar20,(undefined1  [16])valid_i->field_0);
    auVar18 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,5);
    auVar4 = auVar19 & auVar18;
    if ((((auVar4 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar4 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar4 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar4[0xf] < '\0') {
      auVar19 = vandps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar42 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      local_16f8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar18,auVar19);
      auVar18 = *(undefined1 (*) [16])(ray + 0x10);
      auVar23 = ZEXT1664(CONCAT412(-auVar18._12_4_,
                                   CONCAT48(-auVar18._8_4_,auVar18._0_8_ ^ 0x8000000080000000)));
      local_1808._4_4_ = auVar19._4_4_ ^ auVar20._4_4_;
      local_1808._0_4_ = auVar19._0_4_ ^ auVar20._0_4_;
      local_1808._8_4_ = auVar19._8_4_ ^ auVar20._8_4_;
      local_1808._12_4_ = auVar19._12_4_ ^ auVar20._12_4_;
      auVar20 = *(undefined1 (*) [16])(ray + 0x20);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar12;
      stack_near[1].field_0 = local_16f8;
      if (sVar12 != 0xfffffffffffffff8) {
        auVar36._8_4_ = 0x7fffffff;
        auVar36._0_8_ = 0x7fffffff7fffffff;
        auVar36._12_4_ = 0x7fffffff;
        auVar4 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar36);
        auVar40._8_4_ = 0x219392ef;
        auVar40._0_8_ = 0x219392ef219392ef;
        auVar40._12_4_ = 0x219392ef;
        auVar4 = vcmpps_avx(auVar4,auVar40,1);
        auVar24 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar40,auVar4);
        auVar4 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar36);
        auVar4 = vcmpps_avx(auVar4,auVar40,1);
        auVar25 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar40,auVar4);
        auVar4 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar36);
        auVar4 = vcmpps_avx(auVar4,auVar40,1);
        auVar4 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar40,auVar4);
        auVar36 = vrcpps_avx(auVar24);
        auVar28._8_4_ = 0x3f800000;
        auVar28._0_8_ = 0x3f8000003f800000;
        auVar28._12_4_ = 0x3f800000;
        auVar40 = vfnmadd213ps_fma(auVar24,auVar36,auVar28);
        auVar24 = vrcpps_avx(auVar25);
        auVar26 = vfnmadd213ps_fma(auVar25,auVar24,auVar28);
        auVar25 = vrcpps_avx(auVar4);
        auVar4 = vfnmadd213ps_fma(auVar4,auVar25,auVar28);
        local_1768 = vfmadd132ps_fma(auVar26,auVar24,auVar24);
        auVar44 = ZEXT1664(local_1768);
        local_1758 = vfmadd132ps_fma(auVar40,auVar36,auVar36);
        auVar43 = ZEXT1664(local_1758);
        local_1778 = vfmadd132ps_fma(auVar4,auVar25,auVar25);
        auVar45 = ZEXT1664(local_1778);
        pNVar11 = stack_node + 1;
        local_1708 = local_1758._0_4_ * -*(float *)ray;
        fStack_1704 = local_1758._4_4_ * -*(float *)(ray + 4);
        fStack_1700 = local_1758._8_4_ * -*(float *)(ray + 8);
        fStack_16fc = local_1758._12_4_ * -*(float *)(ray + 0xc);
        local_1718 = local_1768._0_4_ * -auVar18._0_4_;
        fStack_1714 = local_1768._4_4_ * -auVar18._4_4_;
        fStack_1710 = local_1768._8_4_ * -auVar18._8_4_;
        fStack_170c = local_1768._12_4_ * -auVar18._12_4_;
        local_1728 = local_1778._0_4_ * -auVar20._0_4_;
        fStack_1724 = local_1778._4_4_ * -auVar20._4_4_;
        fStack_1720 = local_1778._8_4_ * -auVar20._8_4_;
        fStack_171c = local_1778._12_4_ * -auVar20._12_4_;
        auVar18 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT416(0) << 0x20);
        auVar20._8_4_ = 0xff800000;
        auVar20._0_8_ = 0xff800000ff800000;
        auVar20._12_4_ = 0xff800000;
        auVar18 = vblendvps_avx(auVar20,auVar18,auVar19);
        auVar38 = ZEXT1664(auVar18);
        local_1748 = mm_lookupmask_ps._0_8_;
        uStack_1740 = mm_lookupmask_ps._8_8_;
        paVar13 = &stack_near[2].field_0;
        do {
          auVar18 = auVar38._0_16_;
LAB_004e9fb9:
          aVar22 = paVar13[-1];
          paVar13 = paVar13 + -1;
          auVar20 = vcmpps_avx((undefined1  [16])aVar22,auVar38._0_16_,1);
          if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar20[0xf] < '\0') {
LAB_004e9fd4:
            auVar20 = auVar38._0_16_;
            uVar14 = (uint)sVar12;
            if ((sVar12 & 8) == 0) goto code_r0x004e9fde;
            if (sVar12 == 0xfffffffffffffff8) break;
            auVar4 = vcmpps_avx(auVar20,(undefined1  [16])aVar22,6);
            if ((((auVar4 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar4 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar4 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar4[0xf] < '\0') {
              uVar7 = (ulong)(uVar14 & 0xf);
              auVar4 = vpcmpeqd_avx(auVar23._0_16_,auVar23._0_16_);
              auVar17 = local_1808;
              if (uVar7 != 8) {
                auVar24 = local_1808 ^ auVar4;
                uVar10 = 1;
                do {
                  local_17c0.geomID = *(uint *)(((sVar12 & 0xfffffffffffffff0) - 8) + uVar10 * 8);
                  local_1790 = (context->scene->geometries).items[local_17c0.geomID].ptr;
                  uVar14 = local_1790->mask;
                  auVar16._4_4_ = uVar14;
                  auVar16._0_4_ = uVar14;
                  auVar16._8_4_ = uVar14;
                  auVar16._12_4_ = uVar14;
                  auVar20 = vpand_avx(auVar16,*(undefined1 (*) [16])(ray + 0x90));
                  auVar20 = vpcmpeqd_avx(auVar20,_DAT_01f7aa10);
                  auVar4 = auVar24 & ~auVar20;
                  auVar3._8_8_ = uStack_1740;
                  auVar3._0_8_ = local_1748;
                  local_1738 = auVar24;
                  if ((((auVar4 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar4 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar4 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar4[0xf] < '\0') {
                    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vandnps_avx(auVar20,auVar24);
                    local_17c0.primID = *(uint *)(((sVar12 & 0xfffffffffffffff0) - 4) + uVar10 * 8);
                    local_17c0.valid = (int *)&mask;
                    local_17c0.geometryUserPtr = local_1790->userPtr;
                    local_17c0.context = context->user;
                    local_17c0.N = 4;
                    local_1788 = 0;
                    local_1780 = context->args;
                    p_Var8 = local_1780->intersect;
                    if (p_Var8 == (RTCIntersectFunctionN)0x0) {
                      p_Var8 = (RTCIntersectFunctionN)
                               local_1790[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i;
                    }
                    local_17c0.rayhit = (RTCRayHitN *)ray;
                    (*p_Var8)(&local_17c0);
                    auVar3 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa10,1);
                    auVar42 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    auVar43 = ZEXT1664(local_1758);
                    auVar44 = ZEXT1664(local_1768);
                    auVar45 = ZEXT1664(local_1778);
                    auVar38 = ZEXT1664(auVar18);
                  }
                  auVar20 = auVar38._0_16_;
                  auVar24 = vandnps_avx(auVar3,local_1738);
                  auVar4 = local_1738 & ~auVar3;
                } while (((((auVar4 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar4 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar4 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar4[0xf] < '\0') &&
                        (bVar15 = uVar10 < uVar7 - 8, uVar10 = uVar10 + 1, local_1738 = auVar24,
                        bVar15));
                auVar4 = vpcmpeqd_avx(local_1738,local_1738);
                auVar17._0_4_ = auVar24._0_4_ ^ auVar4._0_4_;
                auVar17._4_4_ = auVar24._4_4_ ^ auVar4._4_4_;
                auVar17._8_4_ = auVar24._8_4_ ^ auVar4._8_4_;
                auVar17._12_4_ = auVar24._12_4_ ^ auVar4._12_4_;
              }
              auVar23 = ZEXT1664(auVar4);
              local_1808 = vpor_avx(local_1808,auVar17);
              auVar4 = auVar4 & ~local_1808;
              if ((((auVar4 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar4 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar4 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar4[0xf] < '\0') {
                auVar18._8_4_ = 0xff800000;
                auVar18._0_8_ = 0xff800000ff800000;
                auVar18._12_4_ = 0xff800000;
                auVar18 = vblendvps_avx(auVar20,auVar18,local_1808);
                auVar38 = ZEXT1664(auVar18);
                goto LAB_004ea373;
              }
              break;
            }
          }
LAB_004ea373:
          sVar12 = pNVar11[-1].ptr;
          pNVar11 = pNVar11 + -1;
          if (sVar12 == 0xfffffffffffffff8) break;
        } while( true );
      }
LAB_004ea391:
      auVar18 = vandps_avx(auVar19,local_1808);
      auVar19._8_4_ = 0xff800000;
      auVar19._0_8_ = 0xff800000ff800000;
      auVar19._12_4_ = 0xff800000;
      auVar18 = vmaskmovps_avx(auVar18,auVar19);
      *(undefined1 (*) [16])(ray + 0x80) = auVar18;
    }
  }
  return;
code_r0x004e9fde:
  uVar7 = sVar12 & 0xfffffffffffffff0;
  lVar9 = -0x10;
  sVar12 = 8;
  aVar21 = auVar42._0_16_;
  do {
    sVar2 = *(size_t *)(uVar7 + 0x20 + lVar9 * 2);
    if (sVar2 == 8) {
      auVar23 = ZEXT1664((undefined1  [16])aVar21);
      break;
    }
    uVar1 = *(undefined4 *)(uVar7 + 0x90 + lVar9);
    auVar25._4_4_ = uVar1;
    auVar25._0_4_ = uVar1;
    auVar25._8_4_ = uVar1;
    auVar25._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(uVar7 + 0x30 + lVar9);
    auVar24._4_4_ = uVar1;
    auVar24._0_4_ = uVar1;
    auVar24._8_4_ = uVar1;
    auVar24._12_4_ = uVar1;
    auVar20 = *(undefined1 (*) [16])(ray + 0x70);
    auVar4 = vfmadd231ps_fma(auVar24,auVar20,auVar25);
    uVar1 = *(undefined4 *)(uVar7 + 0xb0 + lVar9);
    auVar29._4_4_ = uVar1;
    auVar29._0_4_ = uVar1;
    auVar29._8_4_ = uVar1;
    auVar29._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(uVar7 + 0x50 + lVar9);
    auVar26._4_4_ = uVar1;
    auVar26._0_4_ = uVar1;
    auVar26._8_4_ = uVar1;
    auVar26._12_4_ = uVar1;
    auVar24 = vfmadd231ps_fma(auVar26,auVar20,auVar29);
    uVar1 = *(undefined4 *)(uVar7 + 0xd0 + lVar9);
    auVar32._4_4_ = uVar1;
    auVar32._0_4_ = uVar1;
    auVar32._8_4_ = uVar1;
    auVar32._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(uVar7 + 0x70 + lVar9);
    auVar30._4_4_ = uVar1;
    auVar30._0_4_ = uVar1;
    auVar30._8_4_ = uVar1;
    auVar30._12_4_ = uVar1;
    auVar40 = vfmadd231ps_fma(auVar30,auVar20,auVar32);
    uVar1 = *(undefined4 *)(uVar7 + 0xa0 + lVar9);
    auVar33._4_4_ = uVar1;
    auVar33._0_4_ = uVar1;
    auVar33._8_4_ = uVar1;
    auVar33._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(uVar7 + 0x40 + lVar9);
    auVar37._4_4_ = uVar1;
    auVar37._0_4_ = uVar1;
    auVar37._8_4_ = uVar1;
    auVar37._12_4_ = uVar1;
    auVar26 = vfmadd231ps_fma(auVar37,auVar20,auVar33);
    uVar1 = *(undefined4 *)(uVar7 + 0xc0 + lVar9);
    auVar34._4_4_ = uVar1;
    auVar34._0_4_ = uVar1;
    auVar34._8_4_ = uVar1;
    auVar34._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(uVar7 + 0x60 + lVar9);
    auVar39._4_4_ = uVar1;
    auVar39._0_4_ = uVar1;
    auVar39._8_4_ = uVar1;
    auVar39._12_4_ = uVar1;
    auVar28 = vfmadd231ps_fma(auVar39,auVar20,auVar34);
    uVar1 = *(undefined4 *)(uVar7 + 0xe0 + lVar9);
    auVar35._4_4_ = uVar1;
    auVar35._0_4_ = uVar1;
    auVar35._8_4_ = uVar1;
    auVar35._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(uVar7 + 0x80 + lVar9);
    auVar41._4_4_ = uVar1;
    auVar41._0_4_ = uVar1;
    auVar41._8_4_ = uVar1;
    auVar41._12_4_ = uVar1;
    auVar29 = vfmadd231ps_fma(auVar41,auVar20,auVar35);
    auVar6._4_4_ = fStack_1704;
    auVar6._0_4_ = local_1708;
    auVar6._8_4_ = fStack_1700;
    auVar6._12_4_ = fStack_16fc;
    auVar25 = vfmadd213ps_fma(auVar4,auVar43._0_16_,auVar6);
    auVar5._4_4_ = fStack_1714;
    auVar5._0_4_ = local_1718;
    auVar5._8_4_ = fStack_1710;
    auVar5._12_4_ = fStack_170c;
    auVar36 = vfmadd213ps_fma(auVar24,auVar44._0_16_,auVar5);
    auVar4._4_4_ = fStack_1724;
    auVar4._0_4_ = local_1728;
    auVar4._8_4_ = fStack_1720;
    auVar4._12_4_ = fStack_171c;
    auVar40 = vfmadd213ps_fma(auVar40,auVar45._0_16_,auVar4);
    auVar26 = vfmadd213ps_fma(auVar26,auVar43._0_16_,auVar6);
    auVar28 = vfmadd213ps_fma(auVar28,auVar44._0_16_,auVar5);
    auVar29 = vfmadd213ps_fma(auVar29,auVar45._0_16_,auVar4);
    auVar4 = vpminsd_avx(auVar25,auVar26);
    auVar24 = vpminsd_avx(auVar36,auVar28);
    auVar4 = vpmaxsd_avx(auVar4,auVar24);
    auVar24 = vpminsd_avx(auVar40,auVar29);
    auVar4 = vpmaxsd_avx(auVar4,auVar24);
    auVar24 = vpmaxsd_avx(auVar25,auVar26);
    auVar38 = ZEXT1664(auVar18);
    auVar25 = vpmaxsd_avx(auVar36,auVar28);
    auVar25 = vpminsd_avx(auVar24,auVar25);
    auVar24 = vpmaxsd_avx(auVar40,auVar29);
    auVar24 = vpminsd_avx(auVar24,auVar18);
    auVar25 = vpminsd_avx(auVar25,auVar24);
    auVar24 = vpmaxsd_avx(auVar4,(undefined1  [16])local_16f8);
    if ((uVar14 & 7) == 6) {
      auVar24 = vcmpps_avx(auVar24,auVar25,2);
      uVar1 = *(undefined4 *)(uVar7 + 0xf0 + lVar9);
      auVar27._4_4_ = uVar1;
      auVar27._0_4_ = uVar1;
      auVar27._8_4_ = uVar1;
      auVar27._12_4_ = uVar1;
      auVar25 = vcmpps_avx(auVar27,auVar20,2);
      uVar1 = *(undefined4 *)(uVar7 + 0x100 + lVar9);
      auVar31._4_4_ = uVar1;
      auVar31._0_4_ = uVar1;
      auVar31._8_4_ = uVar1;
      auVar31._12_4_ = uVar1;
      auVar20 = vcmpps_avx(auVar20,auVar31,1);
      auVar20 = vandps_avx(auVar25,auVar20);
      auVar20 = vandps_avx(auVar20,auVar24);
    }
    else {
      auVar20 = vcmpps_avx(auVar24,auVar25,2);
    }
    auVar24 = vcmpps_avx(auVar18,(undefined1  [16])aVar22,6);
    auVar20 = vandps_avx(auVar20,auVar24);
    auVar20 = vpslld_avx(auVar20,0x1f);
    if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar20 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar20 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar20[0xf]) {
      auVar23 = ZEXT1664((undefined1  [16])aVar21);
      sVar2 = sVar12;
    }
    else {
      auVar20 = vblendvps_avx((undefined1  [16])auVar42._0_16_,auVar4,auVar20);
      auVar23 = ZEXT1664(auVar20);
      if (sVar12 != 8) {
        pNVar11->ptr = sVar12;
        pNVar11 = pNVar11 + 1;
        *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar13->v = aVar21;
        paVar13 = paVar13 + 1;
      }
    }
    sVar12 = sVar2;
    aVar21 = auVar23._0_16_;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0);
  aVar22 = auVar23._0_16_;
  if (sVar12 == 8) goto code_r0x004ea1ad;
  goto LAB_004e9fd4;
code_r0x004ea1ad:
  sVar12 = pNVar11[-1].ptr;
  pNVar11 = pNVar11 + -1;
  if (sVar12 == 0xfffffffffffffff8) goto LAB_004ea391;
  goto LAB_004e9fb9;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }